

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O0

void __thiscall symbols::Env::Env(Env *this,Env *p)

{
  Env *p_local;
  Env *this_local;
  
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_symbols::Object_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_symbols::Object_*>_>_>
  ::unordered_map(&this->table);
  this->prev = p;
  this->depth = 1;
  if (this->prev == (Env *)0x0) {
    setDepth(this,-1);
  }
  else {
    setDepth(this,this->prev->depth);
  }
  return;
}

Assistant:

Env(Env* p)
        :prev{p}
    {
        if(prev != nullptr)
            setDepth(prev->depth);
        else
            setDepth(-1);
    }